

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkillTree.cpp
# Opt level: O1

bool __thiscall SkillTree::tick(SkillTree *this,PixelGameEngine *pge,int64_t *internetPoints)

{
  bool bVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  
  p_Var3 = (this->nodes)._M_h._M_before_begin._M_nxt;
  if (p_Var3 == (_Hash_node_base *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    do {
      bVar1 = SkillTreeNode::tick((SkillTreeNode *)(p_Var3 + 5),pge,this,internetPoints);
      if (bVar1) {
        bVar2 = true;
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return bVar2;
}

Assistant:

bool SkillTree::tick(olc::PixelGameEngine *pge, std::int64_t &internetPoints) {
    bool completedOne = false;
    for (auto &node : nodes) {
	if (node.second.tick(pge, *this, internetPoints)) {
	    completedOne = true;
	}
    }
    return completedOne;
}